

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LinearQuantizationParams * __thiscall
CoreML::Specification::QuantizationParams::mutable_linearquantization(QuantizationParams *this)

{
  bool bVar1;
  LinearQuantizationParams *this_00;
  QuantizationParams *this_local;
  
  bVar1 = has_linearquantization(this);
  if (!bVar1) {
    clear_QuantizationType(this);
    set_has_linearquantization(this);
    this_00 = (LinearQuantizationParams *)operator_new(0x40);
    LinearQuantizationParams::LinearQuantizationParams(this_00);
    (this->QuantizationType_).linearquantization_ = this_00;
  }
  return (this->QuantizationType_).linearquantization_;
}

Assistant:

inline ::CoreML::Specification::LinearQuantizationParams* QuantizationParams::mutable_linearquantization() {
  if (!has_linearquantization()) {
    clear_QuantizationType();
    set_has_linearquantization();
    QuantizationType_.linearquantization_ = new ::CoreML::Specification::LinearQuantizationParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.QuantizationParams.linearQuantization)
  return QuantizationType_.linearquantization_;
}